

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<4> __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
                        *current,CachedAllocator alloc)

{
  extended_range<unsigned_long> *range;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  ThreadLocal2 *pTVar3;
  iterator __position;
  ThreadLocal2 *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  unsigned_long uVar11;
  size_t i_2;
  ulong uVar12;
  long lVar13;
  Vec3fa *pVVar14;
  NodeRefPtr<4> NVar15;
  size_t sVar16;
  undefined8 *puVar17;
  unsigned_long *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  size_t i_1;
  ulong uVar23;
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  *current_00;
  NodeRefPtr<4> values [16];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  children [16];
  ThreadLocal2 *local_838;
  ThreadLocal2 *local_830;
  ThreadLocal2 *local_828;
  bool local_820;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  unsigned_long uStack_7e0;
  undefined8 local_7d8;
  unsigned_long uStack_7d0;
  unsigned_long local_7c8;
  ThreadLocal2 *local_7a8;
  bool local_7a0 [8];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_798;
  undefined8 local_788 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_778;
  unsigned_long local_768 [6];
  BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>
  local_738 [16];
  
  if ((this->cfg).maxDepth < current->depth) {
    puVar17 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_738[0].depth = (size_t)&local_738[0].prims;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_738,"depth limit reached","");
    *puVar17 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar17 + 1) = 1;
    puVar17[2] = puVar17 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar17 + 2),local_738[0].depth,
               (long)&(((CentGeomBBox3fa *)local_738[0].depth)->geomBounds).lower.field_0 +
               CONCAT71(local_738[0]._9_7_,local_738[0].alloc_barrier));
    __cxa_throw(puVar17,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  range = &(current->prims).super_extended_range<unsigned_long>;
  if ((current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin <=
      (this->cfg).maxLeafSize) {
    NVar15 = BVHBuilderBinnedFastSpatialSAH::
             CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
             ::operator()((CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
                           *)this->createLeaf,this->prims,&range->super_range<unsigned_long>,alloc);
    return (NodeRefPtr<4>)NVar15.ptr;
  }
  local_738[0].alloc_barrier = current->alloc_barrier;
  local_738[0].depth = current->depth;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.lower.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.lower.field_0 + 8);
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._0_8_ =
       *(undefined8 *)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0;
  local_738[0].prims.super_CentGeomBBox3fa.centBounds.upper.field_0._8_8_ =
       *(undefined8 *)((long)&(current->prims).super_CentGeomBBox3fa.centBounds.upper.field_0 + 8);
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
       (range->super_range<unsigned_long>)._begin;
  local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
       (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end;
  local_738[0].prims.super_extended_range<unsigned_long>._ext_end =
       (current->prims).super_extended_range<unsigned_long>._ext_end;
  uVar23 = 1;
  do {
    uVar12 = 0xffffffffffffffff;
    puVar18 = &local_738[0].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
               _end;
    uVar19 = 0;
    uVar20 = 0;
    do {
      uVar21 = *puVar18 - ((range<unsigned_long> *)(puVar18 + -1))->_begin;
      if (((this->cfg).maxLeafSize < uVar21) && (uVar20 < uVar21)) {
        uVar12 = uVar19;
        uVar20 = uVar21;
      }
      uVar19 = uVar19 + 1;
      puVar18 = puVar18 + 0xe;
    } while (uVar23 != uVar19);
    if (uVar12 == 0xffffffffffffffff) break;
    local_828 = (ThreadLocal2 *)(current->depth + 1);
    local_820 = false;
    local_818._0_8_ = 0x7f8000007f800000;
    local_818._8_8_ = 0x7f8000007f800000;
    local_808 = 0xff800000ff800000;
    uStack_800 = 0xff800000ff800000;
    local_7f8 = 0x7f8000007f800000;
    uStack_7f0 = 0x7f8000007f800000;
    local_7e8 = 0xff800000ff800000;
    uStack_7e0 = 0xff800000ff800000;
    local_7c8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7a0[0] = false;
    local_798._0_8_ = 0x7f8000007f800000;
    local_798._8_8_ = 0x7f8000007f800000;
    local_788[0] = 0xff800000ff800000;
    local_788[1] = 0xff800000ff800000;
    local_778._0_8_ = 0x7f8000007f800000;
    local_778._8_8_ = 0x7f8000007f800000;
    local_768[0] = 0xff800000ff800000;
    local_768[1] = 0xff800000ff800000;
    local_768[4] = 0;
    local_768[2] = 0;
    local_768[3] = 0;
    local_7a8 = local_828;
    HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
    splitFallback(this->heuristic,&local_738[uVar12].prims,(PrimInfoExtRange *)&local_818.field_1,
                  (PrimInfoExtRange *)&local_798.field_1);
    lVar13 = uVar23 * 0x70;
    local_738[uVar12].alloc_barrier = local_7a0[lVar13];
    local_738[uVar12].depth = *(size_t *)(local_7a0 + lVar13 + -8);
    uVar10 = *(undefined8 *)((long)&local_798 + lVar13 + 8);
    *(undefined8 *)&local_738[uVar12].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         *(undefined8 *)(&local_798 + uVar23 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar12].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) = uVar10;
    uVar10 = local_788[uVar23 * 0xe + 1];
    *(undefined8 *)&local_738[uVar12].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_788[uVar23 * 0xe];
    *(undefined8 *)
     ((long)&local_738[uVar12].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) = uVar10;
    uVar10 = *(undefined8 *)((long)&local_778 + lVar13 + 8);
    *(undefined8 *)&local_738[uVar12].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         *(undefined8 *)(&local_778 + uVar23 * 7);
    *(undefined8 *)
     ((long)&local_738[uVar12].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) = uVar10;
    uVar11 = local_768[uVar23 * 0xe + 1];
    *(undefined8 *)&local_738[uVar12].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         *(undefined8 *)
          &((Vec3fa *)((long)&local_738[uVar23 - 1].prims.super_CentGeomBBox3fa + 0x30))->field_0;
    *(unsigned_long *)
     ((long)&local_738[uVar12].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) = uVar11;
    uVar11 = local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>.
             super_range<unsigned_long>._end;
    local_738[uVar12].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
         _begin;
    local_738[uVar12].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         uVar11;
    local_738[uVar12].prims.super_extended_range<unsigned_long>._ext_end =
         local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>._ext_end;
    *(ThreadLocal2 **)(local_7a0 + lVar13 + -8) = local_828;
    local_7a0[lVar13] = local_820;
    *(undefined8 *)(&local_798 + uVar23 * 7) = local_818._0_8_;
    *(undefined8 *)((long)&local_798 + lVar13 + 8) = local_818._8_8_;
    local_788[uVar23 * 0xe] = local_808;
    local_788[uVar23 * 0xe + 1] = uStack_800;
    *(undefined8 *)(&local_778 + uVar23 * 7) = local_7f8;
    *(undefined8 *)((long)&local_778 + lVar13 + 8) = uStack_7f0;
    *(undefined8 *)
     &((Vec3fa *)((long)&local_738[uVar23 - 1].prims.super_CentGeomBBox3fa + 0x30))->field_0 =
         local_7e8;
    local_768[uVar23 * 0xe + 1] = uStack_7e0;
    local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>._ext_end = local_7c8;
    local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>.
    _begin = local_7d8;
    local_738[uVar23 - 1].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end
         = uStack_7d0;
    local_738[uVar23].alloc_barrier = local_7a0[0];
    local_738[uVar23].depth = (size_t)local_7a8;
    *(undefined8 *)&local_738[uVar23].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 =
         local_798._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar23].prims.super_CentGeomBBox3fa.geomBounds.lower.field_0 + 8) =
         local_798._8_8_;
    *(undefined8 *)&local_738[uVar23].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 =
         local_788[0];
    *(undefined8 *)
     ((long)&local_738[uVar23].prims.super_CentGeomBBox3fa.geomBounds.upper.field_0 + 8) =
         local_788[1];
    *(undefined8 *)&local_738[uVar23].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 =
         local_778._0_8_;
    *(undefined8 *)
     ((long)&local_738[uVar23].prims.super_CentGeomBBox3fa.centBounds.lower.field_0 + 8) =
         local_778._8_8_;
    *(unsigned_long *)&local_738[uVar23].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 =
         local_768[0];
    *(unsigned_long *)
     ((long)&local_738[uVar23].prims.super_CentGeomBBox3fa.centBounds.upper.field_0 + 8) =
         local_768[1];
    local_738[uVar23].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._begin =
         local_768[2];
    local_738[uVar23].prims.super_extended_range<unsigned_long>.super_range<unsigned_long>._end =
         local_768[3];
    local_738[uVar23].prims.super_extended_range<unsigned_long>._ext_end = local_768[4];
    uVar23 = uVar23 + 1;
  } while (uVar23 < (this->cfg).branchingFactor);
  if ((this->cfg).primrefarrayalloc <
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._end -
      (current->prims).super_extended_range<unsigned_long>.super_range<unsigned_long>._begin) {
    BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,embree::sse2::Split2<embree::sse2::BinSplit<32ul>,embree::sse2::SpatialBinSplit<16ul>>>,embree::sse2::HeuristicArraySpatialSAH<embree::sse2::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>,embree::sse2::PrimInfoExtRange,embree::PrimRef,embree::NodeRefPtr<4>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,embree::sse2::PrimInfoExtRange>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  local_838 = (ThreadLocal2 *)0x80;
  pTVar3 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar3->alloc)._M_b._M_p) {
    local_7a0[0] = true;
    local_7a8 = pTVar3;
    MutexSys::lock(&pTVar3->mutex);
    if ((pTVar3->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar3->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar3->alloc1).bytesUsed + (pTVar3->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar3->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar3->alloc0).end + (pTVar3->alloc1).end) -
           ((pTVar3->alloc0).cur + (pTVar3->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar3->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar3->alloc1).bytesWasted + (pTVar3->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar3->alloc0).bytesUsed = 0;
    (pTVar3->alloc0).bytesWasted = 0;
    (pTVar3->alloc0).end = 0;
    (pTVar3->alloc0).allocBlockSize = 0;
    (pTVar3->alloc0).ptr = (char *)0x0;
    (pTVar3->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar3->alloc1).bytesUsed = 0;
      (pTVar3->alloc1).bytesWasted = 0;
      (pTVar3->alloc1).end = 0;
      (pTVar3->alloc1).allocBlockSize = 0;
      (pTVar3->alloc1).ptr = (char *)0x0;
      (pTVar3->alloc1).cur = 0;
    }
    else {
      (pTVar3->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar3->alloc1).ptr = (char *)0x0;
      (pTVar3->alloc1).cur = 0;
      (pTVar3->alloc1).end = 0;
      (pTVar3->alloc1).allocBlockSize = 0;
      (pTVar3->alloc1).bytesUsed = 0;
      (pTVar3->alloc1).bytesWasted = 0;
      (pTVar3->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar3->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_828 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    local_820 = true;
    local_830 = pTVar3;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,&local_830);
    }
    else {
      *__position._M_current = local_830;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_7a0[0] == true) {
      MutexSys::unlock(&local_7a8->mutex);
    }
  }
  pTVar3 = local_838;
  (alloc.talloc0)->bytesUsed = (long)&(local_838->mutex).mutex + (alloc.talloc0)->bytesUsed;
  sVar16 = (alloc.talloc0)->cur;
  uVar12 = (ulong)(-(int)sVar16 & 0xf);
  uVar20 = (long)&(local_838->mutex).mutex + uVar12 + sVar16;
  (alloc.talloc0)->cur = uVar20;
  if ((alloc.talloc0)->end < uVar20) {
    (alloc.talloc0)->cur = sVar16;
    pTVar4 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
    if ((ThreadLocal2 *)((long)local_838 * 4) < pTVar4 || (long)local_838 * 4 - (long)pTVar4 == 0) {
      local_828 = pTVar4;
      pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
      (alloc.talloc0)->ptr = pcVar22;
      sVar16 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar16;
      (alloc.talloc0)->end = (size_t)local_828;
      (alloc.talloc0)->cur = (size_t)pTVar3;
      if (local_828 < pTVar3) {
        (alloc.talloc0)->cur = 0;
        local_828 = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_828);
        (alloc.talloc0)->ptr = pcVar22;
        sVar16 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar16;
        (alloc.talloc0)->end = (size_t)local_828;
        (alloc.talloc0)->cur = (size_t)pTVar3;
        if (local_828 < pTVar3) {
          (alloc.talloc0)->cur = 0;
          pcVar22 = (char *)0x0;
          goto LAB_00c212e6;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar16;
    }
    else {
      pcVar22 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_838);
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar12;
    pcVar22 = (alloc.talloc0)->ptr + (uVar20 - (long)local_838);
  }
LAB_00c212e6:
  pcVar22[0x60] = '\0';
  pcVar22[0x61] = '\0';
  pcVar22[0x62] = -0x80;
  pcVar22[99] = '\x7f';
  pcVar22[100] = '\0';
  pcVar22[0x65] = '\0';
  pcVar22[0x66] = -0x80;
  pcVar22[0x67] = '\x7f';
  pcVar22[0x68] = '\0';
  pcVar22[0x69] = '\0';
  pcVar22[0x6a] = -0x80;
  pcVar22[0x6b] = '\x7f';
  pcVar22[0x6c] = '\0';
  pcVar22[0x6d] = '\0';
  pcVar22[0x6e] = -0x80;
  pcVar22[0x6f] = '\x7f';
  pcVar22[0x40] = '\0';
  pcVar22[0x41] = '\0';
  pcVar22[0x42] = -0x80;
  pcVar22[0x43] = '\x7f';
  pcVar22[0x44] = '\0';
  pcVar22[0x45] = '\0';
  pcVar22[0x46] = -0x80;
  pcVar22[0x47] = '\x7f';
  pcVar22[0x48] = '\0';
  pcVar22[0x49] = '\0';
  pcVar22[0x4a] = -0x80;
  pcVar22[0x4b] = '\x7f';
  pcVar22[0x4c] = '\0';
  pcVar22[0x4d] = '\0';
  pcVar22[0x4e] = -0x80;
  pcVar22[0x4f] = '\x7f';
  pcVar22[0x20] = '\0';
  pcVar22[0x21] = '\0';
  pcVar22[0x22] = -0x80;
  pcVar22[0x23] = '\x7f';
  pcVar22[0x24] = '\0';
  pcVar22[0x25] = '\0';
  pcVar22[0x26] = -0x80;
  pcVar22[0x27] = '\x7f';
  pcVar22[0x28] = '\0';
  pcVar22[0x29] = '\0';
  pcVar22[0x2a] = -0x80;
  pcVar22[0x2b] = '\x7f';
  pcVar22[0x2c] = '\0';
  pcVar22[0x2d] = '\0';
  pcVar22[0x2e] = -0x80;
  pcVar22[0x2f] = '\x7f';
  pcVar22[0x70] = '\0';
  pcVar22[0x71] = '\0';
  pcVar22[0x72] = -0x80;
  pcVar22[0x73] = -1;
  pcVar22[0x74] = '\0';
  pcVar22[0x75] = '\0';
  pcVar22[0x76] = -0x80;
  pcVar22[0x77] = -1;
  pcVar22[0x78] = '\0';
  pcVar22[0x79] = '\0';
  pcVar22[0x7a] = -0x80;
  pcVar22[0x7b] = -1;
  pcVar22[0x7c] = '\0';
  pcVar22[0x7d] = '\0';
  pcVar22[0x7e] = -0x80;
  pcVar22[0x7f] = -1;
  pcVar22[0x50] = '\0';
  pcVar22[0x51] = '\0';
  pcVar22[0x52] = -0x80;
  pcVar22[0x53] = -1;
  pcVar22[0x54] = '\0';
  pcVar22[0x55] = '\0';
  pcVar22[0x56] = -0x80;
  pcVar22[0x57] = -1;
  pcVar22[0x58] = '\0';
  pcVar22[0x59] = '\0';
  pcVar22[0x5a] = -0x80;
  pcVar22[0x5b] = -1;
  pcVar22[0x5c] = '\0';
  pcVar22[0x5d] = '\0';
  pcVar22[0x5e] = -0x80;
  pcVar22[0x5f] = -1;
  pcVar22[0x30] = '\0';
  pcVar22[0x31] = '\0';
  pcVar22[0x32] = -0x80;
  pcVar22[0x33] = -1;
  pcVar22[0x34] = '\0';
  pcVar22[0x35] = '\0';
  pcVar22[0x36] = -0x80;
  pcVar22[0x37] = -1;
  pcVar22[0x38] = '\0';
  pcVar22[0x39] = '\0';
  pcVar22[0x3a] = -0x80;
  pcVar22[0x3b] = -1;
  pcVar22[0x3c] = '\0';
  pcVar22[0x3d] = '\0';
  pcVar22[0x3e] = -0x80;
  pcVar22[0x3f] = -1;
  pcVar22[0] = '\b';
  pcVar22[1] = '\0';
  pcVar22[2] = '\0';
  pcVar22[3] = '\0';
  pcVar22[4] = '\0';
  pcVar22[5] = '\0';
  pcVar22[6] = '\0';
  pcVar22[7] = '\0';
  pcVar22[8] = '\b';
  pcVar22[9] = '\0';
  pcVar22[10] = '\0';
  pcVar22[0xb] = '\0';
  pcVar22[0xc] = '\0';
  pcVar22[0xd] = '\0';
  pcVar22[0xe] = '\0';
  pcVar22[0xf] = '\0';
  pcVar22[0x10] = '\b';
  pcVar22[0x11] = '\0';
  pcVar22[0x12] = '\0';
  pcVar22[0x13] = '\0';
  pcVar22[0x14] = '\0';
  pcVar22[0x15] = '\0';
  pcVar22[0x16] = '\0';
  pcVar22[0x17] = '\0';
  pcVar22[0x18] = '\b';
  pcVar22[0x19] = '\0';
  pcVar22[0x1a] = '\0';
  pcVar22[0x1b] = '\0';
  pcVar22[0x1c] = '\0';
  pcVar22[0x1d] = '\0';
  pcVar22[0x1e] = '\0';
  pcVar22[0x1f] = '\0';
  pVVar14 = &local_738[0].prims.super_CentGeomBBox3fa.geomBounds.upper;
  uVar12 = 0;
  do {
    fVar5 = (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[1];
    fVar6 = (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[2];
    fVar7 = (pVVar14->field_0).m128[0];
    fVar8 = (pVVar14->field_0).m128[1];
    fVar9 = (pVVar14->field_0).m128[2];
    *(float *)(pcVar22 + uVar12 * 4 + 0x20) =
         (((BBox<embree::Vec3fa> *)(pVVar14 + -1))->lower).field_0.m128[0];
    *(float *)(pcVar22 + uVar12 * 4 + 0x40) = fVar5;
    *(float *)(pcVar22 + uVar12 * 4 + 0x60) = fVar6;
    *(float *)(pcVar22 + uVar12 * 4 + 0x30) = fVar7;
    *(float *)(pcVar22 + uVar12 * 4 + 0x50) = fVar8;
    *(float *)(pcVar22 + uVar12 * 4 + 0x70) = fVar9;
    uVar12 = uVar12 + 1;
    pVVar14 = pVVar14 + 7;
  } while (uVar23 != uVar12);
  current_00 = local_738;
  uVar12 = 0;
  do {
    NVar15 = createLargeLeaf(this,current_00,alloc);
    (&local_828)[uVar12] = (ThreadLocal2 *)NVar15.ptr;
    uVar12 = uVar12 + 1;
    current_00 = current_00 + 1;
  } while (uVar23 != uVar12);
  uVar12 = 0;
  do {
    *(ThreadLocal2 **)(pcVar22 + uVar12 * 8) = (&local_828)[uVar12];
    uVar12 = uVar12 + 1;
  } while (uVar23 != uVar12);
  return (NodeRefPtr<4>)(size_t)pcVar22;
}

Assistant:

const ReductionTy createLargeLeaf(const BuildRecord& current, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (current.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* create leaf for few primitives */
            if (current.prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,current.prims))
              return createLeaf(prims,current.prims,alloc);

            /* fill all children by always splitting the largest one */
            ReductionTy values[MAX_BRANCHING_FACTOR];
            BuildRecord children[MAX_BRANCHING_FACTOR];
            size_t numChildren = 1;
            children[0] = current;
            do {

              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<numChildren; i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].prims.size() <= cfg.maxLeafSize && canCreateLeaf(prims,children[i].prims))
                  continue;

                /* remember child with largest size */
                if (children[i].prims.size() > bestSize) {
                  bestSize = children[i].prims.size();
                  bestChild = i;
                }
              }
              if (bestChild == (size_t)-1) break;

              /*! split best child into left and right child */
              BuildRecord left(current.depth+1);
              BuildRecord right(current.depth+1);
              if (!canCreateLeaf(prims,children[bestChild].prims)) {
                canCreateLeafSplit(prims,children[bestChild].prims,left.prims,right.prims);
              } else {
                heuristic.splitFallback(children[bestChild].prims,left.prims,right.prims);
              }

              /* add new children left and right */
              children[bestChild] = children[numChildren-1];
              children[numChildren-1] = left;
              children[numChildren+0] = right;
              numChildren++;

            } while (numChildren < cfg.branchingFactor);

            /* set barrier for primrefarrayalloc */
            if (unlikely(current.size() > cfg.primrefarrayalloc))
              for (size_t i=0; i<numChildren; i++)
                children[i].alloc_barrier = children[i].size() <= cfg.primrefarrayalloc;

            /* create node */
            auto node = createNode(children,numChildren,alloc);

            /* recurse into each child  and perform reduction */
            for (size_t i=0; i<numChildren; i++)
              values[i] = createLargeLeaf(children[i],alloc);

            /* perform reduction */
            return updateNode(current,children,node,values,numChildren);
          }